

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExtendsClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExtendsClauseSyntax,slang::parsing::Token,slang::syntax::NameSyntax&,slang::syntax::ArgumentListSyntax*,slang::syntax::DefaultExtendsClauseArgSyntax*>
          (BumpAllocator *this,Token *args,NameSyntax *args_1,ArgumentListSyntax **args_2,
          DefaultExtendsClauseArgSyntax **args_3)

{
  Token keyword;
  ExtendsClauseSyntax *pEVar1;
  ExtendsClauseSyntax *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  BumpAllocator *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pEVar1 = (ExtendsClauseSyntax *)
           allocate(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  keyword.info = in_RSI;
  keyword.kind = (short)in_RDX;
  keyword._2_1_ = (char)((ulong)in_RDX >> 0x10);
  keyword.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  keyword.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::ExtendsClauseSyntax::ExtendsClauseSyntax
            (in_RCX,keyword,(NameSyntax *)in_R8,(ArgumentListSyntax *)in_RSI->location,
             (DefaultExtendsClauseArgSyntax *)in_RSI->rawTextPtr);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }